

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

AggregateFunctionSet * duckdb::QuantileContFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  element_type *other;
  element_type *local_638;
  element_type *local_630;
  AggregateFunctionSet *local_620;
  _func_int **local_618;
  vector<duckdb::AggregateFunction,_true> *local_610;
  LogicalType local_608;
  element_type *local_5f0;
  LogicalType local_5e8;
  LogicalType local_5d0;
  LogicalType local_5b8;
  LogicalType local_5a0;
  LogicalType local_588;
  LogicalType local_570;
  LogicalType local_558;
  string local_540;
  LogicalType local_520;
  LogicalType local_508;
  AggregateFunction local_4f0;
  AggregateFunction local_3c0;
  AggregateFunction local_290;
  AggregateFunction local_160;
  
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"quantile_cont","");
  local_620 = in_RDI;
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_540);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_558,DECIMAL);
  LogicalType::LogicalType(&local_570,DECIMAL);
  LogicalType::LogicalType((LogicalType *)&local_638,DOUBLE);
  EmptyQuantileFunction<duckdb::ContinuousQuantileFunction>
            (&local_3c0,&local_558,&local_570,(LogicalType *)&local_638);
  local_610 = &(local_620->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&local_610->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_3c0);
  local_618 = (_func_int **)&PTR__AggregateFunction_0243ae10;
  local_3c0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243ae10;
  if (local_3c0.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3c0.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3c0.super_BaseScalarFunction);
  LogicalType::~LogicalType((LogicalType *)&local_638);
  LogicalType::~LogicalType(&local_570);
  LogicalType::~LogicalType(&local_558);
  LogicalType::LogicalType(&local_588,DECIMAL);
  LogicalType::LogicalType(&local_5a0,DECIMAL);
  LogicalType::LogicalType(&local_608,DOUBLE);
  LogicalType::LIST((LogicalType *)&local_638,&local_608);
  EmptyQuantileFunction<duckdb::ContinuousQuantileListFunction>
            (&local_4f0,&local_588,&local_5a0,(LogicalType *)&local_638);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&local_610->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_4f0);
  local_4f0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function = local_618;
  if (local_4f0.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4f0.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_4f0.super_BaseScalarFunction);
  LogicalType::~LogicalType((LogicalType *)&local_638);
  LogicalType::~LogicalType(&local_608);
  LogicalType::~LogicalType(&local_5a0);
  LogicalType::~LogicalType(&local_588);
  GetContinuousQuantileTypes();
  local_5f0 = local_630;
  if (local_638 != local_630) {
    other = local_638;
    do {
      LogicalType::LogicalType(&local_5b8,(LogicalType *)other);
      LogicalType::LogicalType(&local_5d0,(LogicalType *)other);
      LogicalType::LogicalType(&local_608,DOUBLE);
      EmptyQuantileFunction<duckdb::ContinuousQuantileFunction>
                (&local_290,&local_5b8,&local_5d0,&local_608);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_610->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_290);
      local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           local_618;
      if (local_290.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_290.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_290.super_BaseScalarFunction);
      LogicalType::~LogicalType(&local_608);
      LogicalType::~LogicalType(&local_5d0);
      LogicalType::~LogicalType(&local_5b8);
      LogicalType::LogicalType(&local_5e8,(LogicalType *)other);
      LogicalType::LogicalType(&local_508,(LogicalType *)other);
      LogicalType::LogicalType(&local_520,DOUBLE);
      LogicalType::LIST(&local_608,&local_520);
      EmptyQuantileFunction<duckdb::ContinuousQuantileListFunction>
                (&local_160,&local_5e8,&local_508,&local_608);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_610->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_160);
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           local_618;
      if (local_160.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_160.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
      LogicalType::~LogicalType(&local_608);
      LogicalType::~LogicalType(&local_520);
      LogicalType::~LogicalType(&local_508);
      LogicalType::~LogicalType(&local_5e8);
      other = (element_type *)&(other->alias)._M_string_length;
    } while (other != local_5f0);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_638);
  return local_620;
}

Assistant:

AggregateFunctionSet QuantileContFun::GetFunctions() {
	AggregateFunctionSet quantile_cont("quantile_cont");
	quantile_cont.AddFunction(EmptyQuantileFunction<ContinuousQuantileFunction>(
	    LogicalTypeId::DECIMAL, LogicalTypeId::DECIMAL, LogicalType::DOUBLE));
	quantile_cont.AddFunction(EmptyQuantileFunction<ContinuousQuantileListFunction>(
	    LogicalTypeId::DECIMAL, LogicalTypeId::DECIMAL, LogicalType::LIST(LogicalType::DOUBLE)));
	for (const auto &type : GetContinuousQuantileTypes()) {
		quantile_cont.AddFunction(EmptyQuantileFunction<ContinuousQuantileFunction>(type, type, LogicalType::DOUBLE));
		quantile_cont.AddFunction(
		    EmptyQuantileFunction<ContinuousQuantileListFunction>(type, type, LogicalType::LIST(LogicalType::DOUBLE)));
	}
	return quantile_cont;
}